

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O0

Vector * ChebyshevIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                      double OmegaPrecond)

{
  Boolean BVar1;
  LASErrIdType LVar2;
  size_t Dim_00;
  Vector *pVVar3;
  Vector *pVVar4;
  double bNorm_00;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 local_128 [8];
  Vector z;
  Vector p;
  Vector r;
  size_t Dim;
  double bNorm;
  double TNew;
  double TOld;
  double T;
  double Beta;
  double Alpha;
  double d;
  double c;
  double MinEigenval;
  double MaxEigenval;
  int Iter;
  double OmegaPrecond_local;
  PrecondProcType PrecondProc_local;
  int MaxIter_local;
  Vector *b_local;
  Vector *x_local;
  QMatrix *A_local;
  
  TOld = 0.0;
  TNew = 0.0;
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim_00 = Q_GetDim(A);
  V_Constr((Vector *)&p.Cmp,"r",Dim_00,Normal,True);
  V_Constr((Vector *)&z.Cmp,"p",Dim_00,Normal,True);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar1 = Q_KerDefined(A), BVar1 != False)) {
    V_Constr((Vector *)local_128,"z",Dim_00,Normal,True);
  }
  LVar2 = LASResult();
  if (LVar2 == LASOK) {
    bNorm_00 = l2Norm_V(b);
    dVar5 = GetMaxEigenval(A,PrecondProc,OmegaPrecond);
    dVar6 = GetMinEigenval(A,PrecondProc,OmegaPrecond);
    dVar7 = (dVar5 - dVar6) * 0.5;
    dVar5 = (dVar5 + dVar6) * 0.5;
    MaxEigenval._4_4_ = 0;
    dVar6 = l1Norm_V(x);
    auVar8._8_4_ = (int)(Dim_00 >> 0x20);
    auVar8._0_8_ = Dim_00;
    auVar8._12_4_ = 0x45300000;
    if (ABS(dVar6 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)Dim_00) - 4503599627370496.0))) <
        2.2250738585072014e-307) {
      Asgn_VV((Vector *)&p.Cmp,b);
    }
    else {
      BVar1 = Q_KerDefined(A);
      if (BVar1 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar3 = Mul_QV(A,x);
      pVVar3 = Sub_VV(b,pVVar3);
      Asgn_VV((Vector *)&p.Cmp,pVVar3);
    }
    if ((PrecondProc == (PrecondProcType)0x0) && (BVar1 = Q_KerDefined(A), BVar1 == False)) {
      while( true ) {
        dVar6 = l2Norm_V((Vector *)&p.Cmp);
        BVar1 = RTCResult(MaxEigenval._4_4_,dVar6,bNorm_00,ChebyshevIterId);
        if (BVar1 != False || MaxIter <= MaxEigenval._4_4_) break;
        MaxEigenval._4_4_ = MaxEigenval._4_4_ + 1;
        if (MaxEigenval._4_4_ == 1) {
          TNew = 1.0;
          pVVar3 = Mul_SV(1.0 / dVar5,(Vector *)&p.Cmp);
          Asgn_VV((Vector *)&z.Cmp,pVVar3);
          TOld = dVar5 / dVar7;
        }
        else {
          dVar6 = ((dVar5 * 2.0) / dVar7) * TOld + -TNew;
          TNew = TOld;
          pVVar3 = Mul_SV(((2.0 / dVar7) * TOld) / dVar6,(Vector *)&p.Cmp);
          pVVar4 = Mul_SV((((dVar5 * 2.0) / dVar7) * TOld) / dVar6 - 1.0,(Vector *)&z.Cmp);
          pVVar3 = Add_VV(pVVar3,pVVar4);
          Asgn_VV((Vector *)&z.Cmp,pVVar3);
          TOld = dVar6;
        }
        AddAsgn_VV(x,(Vector *)&z.Cmp);
        if (MaxEigenval._4_4_ < MaxIter) {
          pVVar3 = Mul_QV(A,x);
          pVVar3 = Sub_VV(b,pVVar3);
          Asgn_VV((Vector *)&p.Cmp,pVVar3);
        }
      }
    }
    else {
      while( true ) {
        dVar6 = l2Norm_V((Vector *)&p.Cmp);
        BVar1 = RTCResult(MaxEigenval._4_4_,dVar6,bNorm_00,ChebyshevIterId);
        if (BVar1 != False || MaxIter <= MaxEigenval._4_4_) break;
        MaxEigenval._4_4_ = MaxEigenval._4_4_ + 1;
        if (PrecondProc == (PrecondProcType)0x0) {
          Asgn_VV((Vector *)local_128,(Vector *)&p.Cmp);
        }
        else {
          (*PrecondProc)(A,(Vector *)local_128,(Vector *)&p.Cmp,OmegaPrecond);
        }
        BVar1 = Q_KerDefined(A);
        if (BVar1 != False) {
          OrthoRightKer_VQ((Vector *)local_128,A);
        }
        if (MaxEigenval._4_4_ == 1) {
          TNew = 1.0;
          pVVar3 = Mul_SV(1.0 / dVar5,(Vector *)local_128);
          Asgn_VV((Vector *)&z.Cmp,pVVar3);
          TOld = dVar5 / dVar7;
        }
        else {
          dVar6 = ((dVar5 * 2.0) / dVar7) * TOld + -TNew;
          TNew = TOld;
          pVVar3 = Mul_SV(((2.0 / dVar7) * TOld) / dVar6,(Vector *)local_128);
          pVVar4 = Mul_SV((((dVar5 * 2.0) / dVar7) * TOld) / dVar6 - 1.0,(Vector *)&z.Cmp);
          pVVar3 = Add_VV(pVVar3,pVVar4);
          Asgn_VV((Vector *)&z.Cmp,pVVar3);
          TOld = dVar6;
        }
        AddAsgn_VV(x,(Vector *)&z.Cmp);
        if (MaxEigenval._4_4_ < MaxIter) {
          pVVar3 = Mul_QV(A,x);
          pVVar3 = Sub_VV(b,pVVar3);
          Asgn_VV((Vector *)&p.Cmp,pVVar3);
        }
      }
    }
    BVar1 = Q_KerDefined(A);
    if (BVar1 != False) {
      OrthoRightKer_VQ(x,A);
    }
  }
  V_Destr((Vector *)&p.Cmp);
  V_Destr((Vector *)&z.Cmp);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar1 = Q_KerDefined(A), BVar1 != False)) {
    V_Destr((Vector *)local_128);
  }
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *ChebyshevIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     *  The original algorithm doesn't seem to work correctly.
     *  The three term recursion was therefore in the curent version
     *  adopted after
     *
     *  W. Hackbusch: 
     *  Iterative Solution of Large Sparse Systems of Equations,
     *  Springer-Verlag, Berlin, 1994
     *
     */
     
    int Iter;
    double MaxEigenval, MinEigenval;
    double c, d, Alpha, Beta;
    double T = 0.0, TOld = 0.0, TNew; /* values of Chebyshev polynomials */
    double bNorm;
    size_t Dim;
    Vector r, p, z;
    

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);
    V_Constr(&p, "p", Dim, Normal, True);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Constr(&z, "z", Dim, Normal, True);

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        MaxEigenval = GetMaxEigenval(A, PrecondProc, OmegaPrecond);
        MinEigenval = GetMinEigenval(A, PrecondProc, OmegaPrecond);

        c = (MaxEigenval - MinEigenval) / 2.0;
        d = (MaxEigenval + MinEigenval) / 2.0;
	
        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        if (PrecondProc != NULL || Q_KerDefined(A)) {
            /* preconditioned Chebyshev method */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, ChebyshevIterId)
                && Iter < MaxIter) {
                Iter++;
		if (PrecondProc != NULL)
                    (*PrecondProc)(A, &z, &r, OmegaPrecond);
		else
		    Asgn_VV(&z, &r);
		if (Q_KerDefined(A))
		    OrthoRightKer_VQ(&z, A);
                if (Iter == 1) {
                    TOld = 1.0;
	            T = d / c;
                    Alpha = 1.0 / d;
                    Asgn_VV(&p, Mul_SV(Alpha, &z));
                } else {
		    TNew = 2.0 * d / c * T - TOld;
		    TOld = T;
		    T = TNew;
                    Alpha = 2.0 / c * TOld / T;
                    Beta = 2.0 * d / c * TOld / T - 1.0;
                    Asgn_VV(&p, Add_VV(Mul_SV(Alpha, &z), Mul_SV(Beta, &p)));
                }
                AddAsgn_VV(x, &p);
                if (Iter < MaxIter)
                    Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
            }
        } else {
            /* plain Chebyshev method (z = r) */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, ChebyshevIterId)
                && Iter < MaxIter) {
                Iter++;
                if (Iter == 1) {
                    TOld = 1.0;
	            T = d / c;
                    Alpha = 1.0 / d;
                    Asgn_VV(&p, Mul_SV(Alpha, &r));
                } else {
		    TNew = 2.0 * d / c * T - TOld;
		    TOld = T;
		    T = TNew;
                    Alpha = 2.0 / c * TOld / T;
                    Beta = 2.0 * d / c * TOld / T - 1.0;
                    Asgn_VV(&p, Add_VV(Mul_SV(Alpha, &r), Mul_SV(Beta, &p)));
                }
                AddAsgn_VV(x, &p);
                if (Iter < MaxIter)
                    Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
            }
        }
        if (Q_KerDefined(A))
	   OrthoRightKer_VQ(x, A);
    }

    V_Destr(&r);
    V_Destr(&p);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Destr(&z);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}